

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O3

void __thiscall net_tests::anon_unknown_17::V2TransportTester::ReceiveKey(V2TransportTester *this)

{
  pointer __src;
  pointer __dest;
  pointer puVar1;
  ptrdiff_t _Num;
  size_t __n;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  Span<const_std::byte> ellswift;
  const_string msg;
  check_type cVar2;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  assertion_result local_98;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  undefined1 local_60 [24];
  char **local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x490;
  file.m_begin = (iterator)&local_70;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_80,msg);
  local_98.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (0x3f < (ulong)((long)(this->m_received).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_received).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start));
  local_98.m_message.px = (element_type *)0x0;
  local_98.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_48 = &local_a8;
  local_a8 = "m_received.size() >= EllSwiftPubKey::size()";
  local_a0 = "";
  local_60[8] = false;
  local_60._0_8_ = &PTR__lazy_ostream_01389048;
  local_60._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_b0 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_98,(lazy_ostream *)local_60,2,0,WARN,_cVar2,(size_t)&local_b8,0x490);
  boost::detail::shared_count::~shared_count(&local_98.m_message.pn);
  ellswift.m_size = 0x40;
  ellswift.m_data =
       (this->m_received).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  EllSwiftPubKey::EllSwiftPubKey((EllSwiftPubKey *)local_60,ellswift);
  BIP324Cipher::Initialize
            (&this->m_cipher,(EllSwiftPubKey *)local_60,(bool)(this->m_test_initiator ^ 1),false);
  __dest = (this->m_received).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  __src = __dest + 0x40;
  __n = (long)(this->m_received).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish - (long)__src;
  puVar1 = __src;
  if (__n != 0) {
    memmove(__dest,__src,__n);
    puVar1 = (this->m_received).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  }
  if (puVar1 != __dest + ((long)puVar1 - (long)__src)) {
    (this->m_received).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = __dest + ((long)puVar1 - (long)__src);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ReceiveKey()
    {
        // When processing a key, enough bytes need to have been received already.
        BOOST_REQUIRE(m_received.size() >= EllSwiftPubKey::size());
        // Initialize the cipher using it (acting as the opposite side of the tested transport).
        m_cipher.Initialize(MakeByteSpan(m_received).first(EllSwiftPubKey::size()), !m_test_initiator);
        // Strip the processed bytes off the front of the receive buffer.
        m_received.erase(m_received.begin(), m_received.begin() + EllSwiftPubKey::size());
    }